

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O3

bool __thiscall reflection::Field::Verify(Field *this,Verifier *verifier)

{
  ushort uVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  unsigned_short vtsize;
  String *str;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *vec;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *vec_00;
  
  bVar2 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((bVar2) &&
     (bVar2 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>(&this->super_Table,verifier,4),
     bVar2)) {
    if ((*(ushort *)(this + -(long)*(int *)this) < 5) ||
       (uVar3 = (ulong)*(ushort *)(this + (4 - (long)*(int *)this)), uVar3 == 0)) {
      str = (String *)0x0;
    }
    else {
      str = (String *)(this + *(uint *)(this + uVar3) + uVar3);
    }
    bVar2 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,str);
    if (((((bVar2) &&
          (bVar2 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>
                             (&this->super_Table,verifier,6), bVar2)) &&
         ((*(ushort *)(this + -(long)*(int *)this) < 7 ||
          ((uVar3 = (ulong)*(ushort *)(this + (6 - (long)*(int *)this)), uVar3 == 0 ||
           (bVar2 = Type::Verify((Type *)(this + *(uint *)(this + uVar3) + uVar3),verifier), bVar2))
          )))) && (bVar2 = flatbuffers::Table::VerifyField<unsigned_short>
                                     (&this->super_Table,verifier,8,2), bVar2)) &&
       (((bVar2 = flatbuffers::Table::VerifyField<unsigned_short>(&this->super_Table,verifier,10,2),
         bVar2 && (bVar2 = flatbuffers::Table::VerifyField<long>(&this->super_Table,verifier,0xc,8),
                  bVar2)) &&
        (bVar2 = flatbuffers::Table::VerifyField<double>(&this->super_Table,verifier,0xe,8), bVar2))
       )) {
      uVar1 = *(ushort *)(this + -(long)*(int *)this);
      if (0x10 < uVar1) {
        lVar4 = -(long)*(int *)this;
        if ((ulong)*(ushort *)(this + lVar4 + 0x10) != 0) {
          if (verifier->size_ < 2) {
            return false;
          }
          if ((Field *)(verifier->size_ - 1) <
              this + ((ulong)*(ushort *)(this + lVar4 + 0x10) - (long)verifier->buf_)) {
            return false;
          }
        }
        if (0x12 < uVar1) {
          if ((ulong)*(ushort *)(this + lVar4 + 0x12) != 0) {
            if (verifier->size_ < 2) {
              return false;
            }
            if ((Field *)(verifier->size_ - 1) <
                this + ((ulong)*(ushort *)(this + lVar4 + 0x12) - (long)verifier->buf_)) {
              return false;
            }
          }
          if ((0x14 < uVar1) && ((ulong)*(ushort *)(this + lVar4 + 0x14) != 0)) {
            if (verifier->size_ < 2) {
              return false;
            }
            if ((Field *)(verifier->size_ - 1) <
                this + ((ulong)*(ushort *)(this + lVar4 + 0x14) - (long)verifier->buf_)) {
              return false;
            }
          }
        }
      }
      bVar2 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,0x16);
      if (bVar2) {
        lVar4 = -(long)*(int *)this;
        if ((0x16 < *(ushort *)(this + -(long)*(int *)this)) &&
           (uVar3 = (ulong)*(ushort *)(this + lVar4 + 0x16), uVar3 != 0)) {
          bVar2 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                            (verifier,(uint8_t *)(this + *(uint *)(this + uVar3) + uVar3),4,
                             (size_t *)0x0);
          if (!bVar2) {
            return false;
          }
          lVar4 = -(long)*(int *)this;
        }
        if ((*(ushort *)(this + lVar4) < 0x17) ||
           (uVar3 = (ulong)*(ushort *)(this + lVar4 + 0x16), uVar3 == 0)) {
          vec = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)0x0;
        }
        else {
          vec = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)
                (this + *(uint *)(this + uVar3) + uVar3);
        }
        bVar2 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::KeyValue>
                          (verifier,vec);
        if ((bVar2) &&
           (bVar2 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,0x18)
           , bVar2)) {
          lVar4 = -(long)*(int *)this;
          if ((0x18 < *(ushort *)(this + -(long)*(int *)this)) &&
             (uVar3 = (ulong)*(ushort *)(this + lVar4 + 0x18), uVar3 != 0)) {
            bVar2 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                              (verifier,(uint8_t *)(this + *(uint *)(this + uVar3) + uVar3),4,
                               (size_t *)0x0);
            if (!bVar2) {
              return false;
            }
            lVar4 = -(long)*(int *)this;
          }
          if ((*(ushort *)(this + lVar4) < 0x19) ||
             (uVar3 = (ulong)*(ushort *)(this + lVar4 + 0x18), uVar3 == 0)) {
            vec_00 = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0;
          }
          else {
            vec_00 = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)
                     (this + *(uint *)(this + uVar3) + uVar3);
          }
          bVar2 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfStrings(verifier,vec_00);
          if (bVar2) {
            if ((0x1a < *(ushort *)(this + -(long)*(int *)this)) &&
               ((ulong)*(ushort *)(this + (0x1a - (long)*(int *)this)) != 0)) {
              if (verifier->size_ < 2) {
                return false;
              }
              if ((Field *)(verifier->size_ - 1) <
                  this + ((ulong)*(ushort *)(this + (0x1a - (long)*(int *)this)) -
                         (long)verifier->buf_)) {
                return false;
              }
            }
            bVar2 = flatbuffers::Table::VerifyField<unsigned_short>
                              (&this->super_Table,verifier,0x1c,2);
            if (bVar2) {
              if ((0x1e < *(ushort *)(this + -(long)*(int *)this)) &&
                 ((ulong)*(ushort *)(this + (0x1e - (long)*(int *)this)) != 0)) {
                if (verifier->size_ < 2) {
                  return false;
                }
                if ((Field *)(verifier->size_ - 1) <
                    this + ((ulong)*(ushort *)(this + (0x1e - (long)*(int *)this)) -
                           (long)verifier->buf_)) {
                  return false;
                }
              }
              verifier->depth_ = verifier->depth_ - 1;
              return true;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffsetRequired(verifier, VT_NAME) &&
           verifier.VerifyString(name()) &&
           VerifyOffsetRequired(verifier, VT_TYPE) &&
           verifier.VerifyTable(type()) &&
           VerifyField<uint16_t>(verifier, VT_ID, 2) &&
           VerifyField<uint16_t>(verifier, VT_OFFSET, 2) &&
           VerifyField<int64_t>(verifier, VT_DEFAULT_INTEGER, 8) &&
           VerifyField<double>(verifier, VT_DEFAULT_REAL, 8) &&
           VerifyField<uint8_t>(verifier, VT_DEPRECATED, 1) &&
           VerifyField<uint8_t>(verifier, VT_REQUIRED, 1) &&
           VerifyField<uint8_t>(verifier, VT_KEY, 1) &&
           VerifyOffset(verifier, VT_ATTRIBUTES) &&
           verifier.VerifyVector(attributes()) &&
           verifier.VerifyVectorOfTables(attributes()) &&
           VerifyOffset(verifier, VT_DOCUMENTATION) &&
           verifier.VerifyVector(documentation()) &&
           verifier.VerifyVectorOfStrings(documentation()) &&
           VerifyField<uint8_t>(verifier, VT_OPTIONAL, 1) &&
           VerifyField<uint16_t>(verifier, VT_PADDING, 2) &&
           VerifyField<uint8_t>(verifier, VT_OFFSET64, 1) &&
           verifier.EndTable();
  }